

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O3

Matrix<double,_3,_3> *
math::matrix_inverse<double>
          (Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *m,double *det)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  double local_58 [9];
  double local_10;
  
  dVar1 = m->m[4];
  dVar2 = m->m[8];
  dVar3 = m->m[5];
  dVar4 = m->m[7];
  local_10 = m->m[1];
  dVar5 = m->m[6];
  dVar6 = m->m[2];
  dVar7 = m->m[0];
  dVar8 = m->m[3];
  local_58[0] = dVar1 * dVar2 - dVar4 * dVar3;
  local_58[1] = dVar6 * dVar4 - dVar2 * local_10;
  local_58[2] = local_10 * dVar3 - dVar1 * dVar6;
  local_58[3] = dVar3 * dVar5 - dVar2 * dVar8;
  local_58[4] = dVar7 * dVar2 - dVar5 * dVar6;
  local_58[5] = dVar6 * dVar8 - dVar3 * dVar7;
  local_58[6] = dVar8 * dVar4 - dVar5 * dVar1;
  local_58[7] = local_10 * dVar5 - dVar4 * dVar7;
  local_58[8] = dVar7 * dVar1 - dVar8 * local_10;
  dVar1 = *det;
  lVar9 = 0;
  do {
    *(double *)((long)local_58 + lVar9) = *(double *)((long)local_58 + lVar9) / dVar1;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x48);
  lVar9 = 9;
  pdVar10 = local_58;
  pdVar11 = __return_storage_ptr__->m;
  for (; lVar9 != 0; lVar9 = lVar9 + -1) {
    *pdVar11 = *pdVar10;
    pdVar10 = pdVar10 + 1;
    pdVar11 = pdVar11 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T,3,3>
matrix_inverse (Matrix<T,3,3> const& m, T const& det)
{
    Matrix<T,3,3> ret;
    ret[0] = m[4] * m[8] - m[5] * m[7];
    ret[1] = m[2] * m[7] - m[1] * m[8];
    ret[2] = m[1] * m[5] - m[2] * m[4];
    ret[3] = m[5] * m[6] - m[3] * m[8];
    ret[4] = m[0] * m[8] - m[2] * m[6];
    ret[5] = m[2] * m[3] - m[0] * m[5];
    ret[6] = m[3] * m[7] - m[4] * m[6];
    ret[7] = m[1] * m[6] - m[0] * m[7];
    ret[8] = m[0] * m[4] - m[1] * m[3];
    return ret / det;
}